

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint16_t uVar6;
  int iVar7;
  float fVar8;
  uint32_t ui;
  long lVar9;
  long *in_RDI;
  int s_8;
  uint32_t *src_8;
  uint32_t fint_3;
  int s_7;
  uint32_t *src_7;
  uint32_t fint_2;
  int s_6;
  uint32_t *src_6;
  uint32_t fint_1;
  int s_5;
  uint32_t *src_5;
  int s_4;
  uint32_t *src_4;
  uint32_t fint;
  int s_3;
  uint32_t *src_3;
  uint16_t cval_1;
  int s_2;
  uint16_t *src_2;
  uint16_t cval;
  int s_1;
  uint16_t *src_1;
  int s;
  uint16_t *src;
  uint8_t *cdata;
  int32_t tmp;
  int32_t samps;
  void *outpix;
  int x_1;
  int x;
  size_t pixstride;
  int32_t prevsamps;
  exr_coding_channel_info_t *decc;
  int c;
  int y;
  int ubpc;
  int bpc;
  int h;
  int w;
  void **pdata;
  int32_t *sampbuffer;
  uint8_t *srcbuffer;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  int local_104;
  int local_f4;
  int local_e4;
  int local_d4;
  int local_c4;
  int local_b4;
  int local_a4;
  int local_94;
  int local_84;
  float *local_78;
  int local_6c;
  int local_60;
  int local_5c;
  int local_4c;
  int local_40;
  int local_3c;
  long *local_28;
  long local_20;
  
  local_20 = in_RDI[0x12];
  iVar2 = (int)in_RDI[5];
  iVar3 = *(int *)((long)in_RDI + 0x24);
  local_3c = 0;
  do {
    if (iVar3 <= local_3c) {
      return 0;
    }
    for (local_40 = 0; local_40 < (short)in_RDI[1]; local_40 = local_40 + 1) {
      lVar9 = *in_RDI + (long)local_40 * 0x30;
      local_4c = 0;
      iVar7 = (int)*(short *)(lVar9 + 0x1c);
      if (*(long *)(lVar9 + 0x28) == 0) {
        if ((*(ushort *)((long)in_RDI + 10) & 1) != 0) {
          for (local_5c = 0; local_5c < iVar2; local_5c = local_5c + 1) {
          }
        }
      }
      else {
        local_28 = (long *)((long)local_3c * ((ulong)(long)*(int *)(lVar9 + 0x24) >> 3) * 8 +
                           *(long *)(lVar9 + 0x28));
        iVar4 = *(int *)(lVar9 + 0x20);
        for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
          local_78 = (float *)*local_28;
          iVar5 = *(int *)(local_20 + (long)local_60 * 4);
          local_6c = iVar5;
          if ((*(ushort *)((long)in_RDI + 10) & 1) == 0) {
            local_6c = iVar5 - local_4c;
            local_4c = iVar5;
          }
          local_28 = (long *)(((long)iVar4 & 0xfffffffffffffff8U) + (long)local_28);
          if (local_78 != (float *)0x0) {
            sVar1 = *(short *)(lVar9 + 0x1a);
            if (sVar1 == 0) {
              sVar1 = *(short *)(lVar9 + 0x1e);
              if (sVar1 == 0) {
                for (local_104 = 0; local_104 < local_6c; local_104 = local_104 + 1) {
                  fVar8 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                                   in_stack_fffffffffffffef0));
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else if (sVar1 == 1) {
                for (local_e4 = 0; local_e4 < local_6c; local_e4 = local_e4 + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0));
                  uVar6 = uint_to_half(0x1518a0);
                  *(uint16_t *)local_78 = uVar6;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else {
                if (sVar1 != 2) {
                  return 3;
                }
                for (local_f4 = 0; local_f4 < local_6c; local_f4 = local_f4 + 1) {
                  ui = unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                         in_stack_fffffffffffffef0));
                  fVar8 = uint_to_float(ui);
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
            }
            else if (sVar1 == 1) {
              in_stack_fffffffffffffef4 = (uint)*(ushort *)(lVar9 + 0x1e);
              if (in_stack_fffffffffffffef4 == 0) {
                for (local_a4 = 0; local_a4 < local_6c; local_a4 = local_a4 + 1) {
                  unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0));
                  fVar8 = (float)half_to_uint(0x15);
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else if (in_stack_fffffffffffffef4 == 1) {
                for (local_84 = 0; local_84 < local_6c; local_84 = local_84 + 1) {
                  uVar6 = unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                            in_stack_fffffffffffffef0));
                  *(uint16_t *)local_78 = uVar6;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else {
                if (in_stack_fffffffffffffef4 != 2) {
                  return 3;
                }
                for (local_94 = 0; local_94 < local_6c; local_94 = local_94 + 1) {
                  uVar6 = unaligned_load16((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                            in_stack_fffffffffffffef0));
                  fVar8 = half_to_float(uVar6);
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
            }
            else {
              if (sVar1 != 2) {
                return 3;
              }
              in_stack_fffffffffffffef0 = (uint)*(ushort *)(lVar9 + 0x1e);
              if (in_stack_fffffffffffffef0 == 0) {
                for (local_d4 = 0; local_d4 < local_6c; local_d4 = local_d4 + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0));
                  fVar8 = (float)float_to_uint_int(0);
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else if (in_stack_fffffffffffffef0 == 1) {
                for (local_b4 = 0; local_b4 < local_6c; local_b4 = local_b4 + 1) {
                  unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                    in_stack_fffffffffffffef0));
                  uVar6 = float_to_half_int(0);
                  *(uint16_t *)local_78 = uVar6;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
              else {
                if (in_stack_fffffffffffffef0 != 2) {
                  return 3;
                }
                for (local_c4 = 0; local_c4 < local_6c; local_c4 = local_c4 + 1) {
                  fVar8 = (float)unaligned_load32((void *)CONCAT44(in_stack_fffffffffffffef4,
                                                                   in_stack_fffffffffffffef0));
                  *local_78 = fVar8;
                  local_78 = (float *)((long)local_78 + (long)iVar7);
                }
              }
            }
          }
        }
      }
    }
    local_20 = local_20 + (long)iVar2 * 4;
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (!pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = (uint8_t*) outpix;
                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += bpc * samps;
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}